

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaProps_Decode(CLzmaProps *p,Byte *data,uint size)

{
  byte bVar1;
  Byte d;
  UInt32 dicSize;
  uint size_local;
  Byte *data_local;
  CLzmaProps *p_local;
  SRes local_4;
  
  if (size < 5) {
    local_4 = 4;
  }
  else {
    dicSize = *(UInt32 *)(data + 1);
    if (dicSize < 0x1000) {
      dicSize = 0x1000;
    }
    p->dicSize = dicSize;
    bVar1 = *data;
    if (bVar1 < 0xe1) {
      p->lc = (uint)bVar1 % 9;
      p->pb = (bVar1 / 9) / 5;
      p->lp = (uint)(bVar1 / 9) % 5;
      local_4 = 0;
    }
    else {
      local_4 = 4;
    }
  }
  return local_4;
}

Assistant:

SRes LzmaProps_Decode(CLzmaProps *p, const Byte *data, unsigned size)
{
  UInt32 dicSize;
  Byte d;
  
  if (size < LZMA_PROPS_SIZE)
    return SZ_ERROR_UNSUPPORTED;
  else
    dicSize = data[1] | ((UInt32)data[2] << 8) | ((UInt32)data[3] << 16) | ((UInt32)data[4] << 24);
 
  if (dicSize < LZMA_DIC_MIN)
    dicSize = LZMA_DIC_MIN;
  p->dicSize = dicSize;

  d = data[0];
  if (d >= (9 * 5 * 5))
    return SZ_ERROR_UNSUPPORTED;

  p->lc = d % 9;
  d /= 9;
  p->pb = d / 5;
  p->lp = d % 5;

  return SZ_OK;
}